

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

void __thiscall
ON_XMLPropertyPrivate::operator=(ON_XMLPropertyPrivate *this,ON_XMLPropertyPrivate *other)

{
  ON_XMLPropertyPrivate *other_local;
  ON_XMLPropertyPrivate *this_local;
  
  if (other != this) {
    ON_REMOVE_ASAP_AssertEx
              ((uint)(this->_data != (CPropertyData *)0x0),
               "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xml.cpp"
               ,0x66e,"","nullptr != _data is false");
    ON_REMOVE_ASAP_AssertEx
              ((uint)(other->_data != (CPropertyData *)0x0),
               "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xml.cpp"
               ,0x66f,"","nullptr != other._data is false");
    CPropertyData::AddRef(other->_data);
    CPropertyData::Release(this->_data);
    this->_data = other->_data;
  }
  return;
}

Assistant:

void ON_XMLPropertyPrivate::operator = (const ON_XMLPropertyPrivate& other)
{
  if (&other == this)
    return;

  ON_ASSERT(nullptr != _data);
  ON_ASSERT(nullptr != other._data);

  other._data->AddRef();
  _data->Release();
  _data = other._data;
}